

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall
GlobOpt::OptConstFoldBinary
          (GlobOpt *this,Instr **pInstr,IntConstantBounds *src1IntConstantBounds,
          IntConstantBounds *src2IntConstantBounds,Value **pDstVal)

{
  StackSym *this_00;
  Instr *instr;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  uint sourceContextId;
  uint functionId;
  IntConstOpnd *newSrc;
  undefined4 *puVar4;
  JITTimeFunctionBody *this_01;
  FunctionJITTimeInfo *this_02;
  Value *pVVar5;
  IntConstType src2Const;
  IntConstType src1Const;
  char *this_03;
  GlobOpt *pGVar6;
  int intConst;
  ulong local_48;
  IntConstType tmpValueOut;
  GlobOpt *local_38;
  
  bVar2 = DoConstFold(this);
  if (!bVar2) {
    return false;
  }
  src1Const = -1;
  src2Const = -1;
  if ((*pInstr)->m_kind != InstrKindBranch) {
    src1Const = (IntConstType)src1IntConstantBounds->lowerBound;
    if (src1IntConstantBounds->lowerBound != src1IntConstantBounds->upperBound) {
      return false;
    }
    src2Const = (IntConstType)src2IntConstantBounds->lowerBound;
    if (src2IntConstantBounds->lowerBound != src2IntConstantBounds->upperBound) {
      return false;
    }
  }
  bVar2 = IR::Instr::BinaryCalculator(*pInstr,src1Const,src2Const,(IntConstType *)&local_48,TyInt32)
  ;
  if (!bVar2) {
    return false;
  }
  intConst = (int)local_48;
  if ((long)intConst != local_48) {
    return false;
  }
  CaptureByteCodeSymUses(this,*pInstr);
  tmpValueOut = (IntConstType)intConst;
  newSrc = IR::IntConstOpnd::New(tmpValueOut,TyInt32,(*pInstr)->m_func,false);
  IR::Instr::ReplaceSrc1(*pInstr,&newSrc->super_Opnd);
  IR::Instr::FreeSrc2(*pInstr);
  OptSrc(this,&newSrc->super_Opnd,pInstr,(Value **)0x0,(IndirOpnd *)0x0);
  pGVar6 = (GlobOpt *)(*pInstr)->m_dst;
  OVar3 = IR::Opnd::GetKind((Opnd *)pGVar6);
  local_38 = pGVar6;
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3118,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
    if (!bVar2) goto LAB_0045c985;
    *puVar4 = 0;
  }
  pGVar6 = local_38;
  OVar3 = IR::Opnd::GetKind((Opnd *)local_38);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar2) goto LAB_0045c985;
    *puVar4 = 0;
    pGVar6 = local_38;
  }
  this_00 = (StackSym *)pGVar6->intConstantToStackSymMap;
  if (((this_00->field_0x18 & 1) != 0) && ((this_00->field_5).m_instrDef != (Instr *)0x0)) {
    StackSym::SetIsIntConst(this_00,tmpValueOut);
  }
  this_01 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_01);
  this_02 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,GlobOptPhase,sourceContextId,functionId);
  pGVar6 = local_38;
  if (bVar2) {
    Output::Print(L"TRACE ");
    if (this->prePassLoop != (Loop *)0x0) {
      Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                    (ulong)(this->prePassLoop->loopNumber - 1));
    }
    Output::Print(L": ");
    Output::Print(L"Constant folding to %d: \n",local_48 & 0xffffffff);
    IR::Instr::Dump(*pInstr);
    Output::Flush();
  }
  pVVar5 = GetIntConstantValue(this,intConst,*pInstr,(Opnd *)pGVar6);
  *pDstVal = pVVar5;
  bVar2 = IsTypeSpecPhaseOff(this->func);
  instr = *pInstr;
  if (bVar2) {
    instr->m_opcode = LdC_A_I4;
    this_03 = (char *)pGVar6;
    OVar3 = IR::Opnd::GetKind((Opnd *)pGVar6);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      this_03 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
      ;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) {
LAB_0045c985:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    ToVarStackSym((GlobOpt *)this_03,(StackSym *)pGVar6->intConstantToStackSymMap,this->currentBlock
                 );
  }
  else {
    instr->m_opcode = Ld_I4;
    OVar3 = IR::Opnd::GetKind((Opnd *)pGVar6);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) goto LAB_0045c985;
      *puVar4 = 0;
      pGVar6 = local_38;
    }
    ToInt32Dst(this,instr,(RegOpnd *)pGVar6,this->currentBlock);
  }
  InvalidateInductionVariables(this,*pInstr);
  return true;
}

Assistant:

bool
GlobOpt::OptConstFoldBinary(
    IR::Instr * *pInstr,
    const IntConstantBounds &src1IntConstantBounds,
    const IntConstantBounds &src2IntConstantBounds,
    Value **pDstVal)
{
    IR::Instr * &instr = *pInstr;
    int32 value;
    IR::IntConstOpnd *constOpnd;

    if (!DoConstFold())
    {
        return false;
    }

    int32 src1IntConstantValue = -1;
    int32 src2IntConstantValue = -1;

    int32 src1MaxIntConstantValue = -1;
    int32 src2MaxIntConstantValue = -1;
    int32 src1MinIntConstantValue = -1;
    int32 src2MinIntConstantValue = -1;

    if (instr->IsBranchInstr())
    {
        src1MinIntConstantValue = src1IntConstantBounds.LowerBound();
        src1MaxIntConstantValue = src1IntConstantBounds.UpperBound();
        src2MinIntConstantValue = src2IntConstantBounds.LowerBound();
        src2MaxIntConstantValue = src2IntConstantBounds.UpperBound();
    }
    else if (src1IntConstantBounds.IsConstant() && src2IntConstantBounds.IsConstant())
    {
        src1IntConstantValue = src1IntConstantBounds.LowerBound();
        src2IntConstantValue = src2IntConstantBounds.LowerBound();
    }
    else
    {
        return false;
    }

    IntConstType tmpValueOut;
    if (!instr->BinaryCalculator(src1IntConstantValue, src2IntConstantValue, &tmpValueOut, TyInt32)
        || !Math::FitsInDWord(tmpValueOut))
    {
        return false;
    }

    value = (int32)tmpValueOut;

    this->CaptureByteCodeSymUses(instr);
    constOpnd = IR::IntConstOpnd::New(value, TyInt32, instr->m_func);
    instr->ReplaceSrc1(constOpnd);
    instr->FreeSrc2();

    this->OptSrc(constOpnd, &instr);

    IR::Opnd *dst = instr->GetDst();
    Assert(dst->IsRegOpnd());

    StackSym *dstSym = dst->AsRegOpnd()->m_sym;

    if (dstSym->IsSingleDef())
    {
        dstSym->SetIsIntConst(value);
    }

    GOPT_TRACE_INSTR(instr, _u("Constant folding to %d: \n"), value);

    *pDstVal = GetIntConstantValue(value, instr, dst);

    if (IsTypeSpecPhaseOff(this->func))
    {
        instr->m_opcode = Js::OpCode::LdC_A_I4;
        this->ToVarRegOpnd(dst->AsRegOpnd(), this->currentBlock);
    }
    else
    {
        instr->m_opcode = Js::OpCode::Ld_I4;
        this->ToInt32Dst(instr, dst->AsRegOpnd(), this->currentBlock);
    }

    InvalidateInductionVariables(instr);

    return true;
}